

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O2

bool __thiscall r_exec::StructureValue::contains(StructureValue *this,Atom *s)

{
  _Object *p_Var1;
  char cVar2;
  undefined1 uVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar8;
  ulong uVar9;
  undefined4 extraout_var_01;
  float fVar10;
  float fVar11;
  Atom _a;
  Atom a;
  
  p_Var1 = (this->structure).object;
  bVar5 = 0;
  iVar6 = (*p_Var1->_vptr__Object[4])(p_Var1,0);
  cVar2 = r_code::Atom::operator!=((Atom *)CONCAT44(extraout_var,iVar6),s);
  if (cVar2 == '\0') {
    p_Var1 = (this->structure).object;
    (*p_Var1->_vptr__Object[4])(p_Var1,0);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x39) {
      p_Var1 = (this->structure).object;
      iVar6 = (*p_Var1->_vptr__Object[4])(p_Var1,0);
      uVar8 = r_code::Utils::GetTimestamp((Atom *)CONCAT44(extraout_var_00,iVar6));
      uVar9 = r_code::Utils::GetTimestamp(s);
      uVar3 = r_code::Utils::Synchronous(uVar8,uVar9);
      return (bool)uVar3;
    }
    uVar8 = 1;
    bVar5 = 0;
    do {
      uVar7 = (*((this->structure).object)->_vptr__Object[6])();
      if ((uVar7 & 0xffff) <= uVar8) {
        bVar5 = 1;
        break;
      }
      p_Var1 = (this->structure).object;
      iVar6 = (*p_Var1->_vptr__Object[4])(p_Var1,uVar8 & 0xffff);
      _a = *(undefined4 *)CONCAT44(extraout_var_01,iVar6);
      __a = *(undefined4 *)(s + uVar8 * 4);
      cVar2 = r_code::Atom::operator==(&a,&_a);
      if (cVar2 == '\0') {
        cVar4 = r_code::Atom::isFloat();
        if ((cVar4 == '\0') || (cVar4 = r_code::Atom::isFloat(), cVar4 == '\0')) {
          bVar5 = 0;
        }
        else {
          fVar10 = (float)r_code::Atom::asFloat();
          fVar11 = (float)r_code::Atom::asFloat();
          bVar5 = r_code::Utils::Equal((double)fVar10,(double)fVar11);
        }
      }
      r_code::Atom::~Atom(&_a);
      r_code::Atom::~Atom(&a);
      uVar8 = uVar8 + 1;
    } while (cVar2 != '\0');
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool StructureValue::contains(const Atom *s) const
{
    if (structure->code(0) != s[0]) {
        return false;
    }

    if (structure->code(0).getDescriptor() == Atom::TIMESTAMP) {
        return Utils::Synchronous(Utils::GetTimestamp(&structure->code(0)), Utils::GetTimestamp(s));
    }

    for (uint16_t i = 1; i < structure->code_size(); ++i) {
        Atom a = structure->code(i);
        Atom _a = s[i];

        if (a == _a) {
            continue;
        }

        if (a.isFloat() && _a.isFloat()) {
            return Utils::Equal(a.asFloat(), _a.asFloat());
        }

        return false;
    }

    return true;
}